

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O2

int xmlFARecurseDeterminism
              (xmlRegParserCtxtPtr ctxt,xmlRegStatePtr state,int fromnr,int tonr,xmlRegAtomPtr atom)

{
  uint uVar1;
  xmlRegTrans *pxVar2;
  xmlRegAtomPtr atom1;
  uint deep;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  iVar6 = 1;
  if ((state != (xmlRegStatePtr)0x0) && (state->markd != XML_REGEXP_MARK_VISITED)) {
    deep = ~ctxt->flags & 1;
    uVar5 = 0;
    uVar4 = (ulong)(uint)state->nbTrans;
    if (state->nbTrans < 1) {
      uVar4 = uVar5;
    }
    iVar6 = 1;
    for (; uVar4 * 0x18 - uVar5 != 0; uVar5 = uVar5 + 0x18) {
      pxVar2 = state->trans;
      uVar1 = *(uint *)((long)&pxVar2->to + uVar5);
      if (uVar1 != fromnr && -1 < (int)uVar1) {
        atom1 = *(xmlRegAtomPtr *)((long)&pxVar2->atom + uVar5);
        if (atom1 == (xmlRegAtomPtr)0x0) {
          state->markd = XML_REGEXP_MARK_VISITED;
          iVar3 = xmlFARecurseDeterminism(ctxt,ctxt->states[uVar1],fromnr,tonr,atom);
          if (iVar3 == 0) {
            iVar6 = 0;
          }
        }
        else {
          iVar3 = xmlFACompareAtoms(atom1,atom,deep);
          if (iVar3 != 0) {
            if (*(int *)((long)&pxVar2->to + uVar5) == tonr) {
              iVar3 = xmlFAEqualAtoms(*(xmlRegAtomPtr *)((long)&pxVar2->atom + uVar5),atom,deep);
              if (iVar3 == 0) goto LAB_00176c46;
            }
            else {
LAB_00176c46:
              iVar6 = 0;
            }
            *(undefined4 *)((long)&pxVar2->nd + uVar5) = 1;
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

static int
xmlFARecurseDeterminism(xmlRegParserCtxtPtr ctxt, xmlRegStatePtr state,
	                int fromnr, int tonr, xmlRegAtomPtr atom) {
    int ret = 1;
    int res;
    int transnr, nbTrans;
    xmlRegTransPtr t1;
    int deep = 1;

    if (state == NULL)
	return(ret);
    if (state->markd == XML_REGEXP_MARK_VISITED)
	return(ret);

    if (ctxt->flags & AM_AUTOMATA_RNG)
        deep = 0;

    /*
     * don't recurse on transitions potentially added in the course of
     * the elimination.
     */
    nbTrans = state->nbTrans;
    for (transnr = 0;transnr < nbTrans;transnr++) {
	t1 = &(state->trans[transnr]);
	/*
	 * check transitions conflicting with the one looked at
	 */
        if ((t1->to < 0) || (t1->to == fromnr))
            continue;
	if (t1->atom == NULL) {
	    state->markd = XML_REGEXP_MARK_VISITED;
	    res = xmlFARecurseDeterminism(ctxt, ctxt->states[t1->to],
		                          fromnr, tonr, atom);
	    if (res == 0) {
	        ret = 0;
		/* t1->nd = 1; */
	    }
	    continue;
	}
	if (xmlFACompareAtoms(t1->atom, atom, deep)) {
            /* Treat equal transitions as deterministic. */
            if ((t1->to != tonr) ||
                (!xmlFAEqualAtoms(t1->atom, atom, deep)))
                ret = 0;
	    /* mark the transition as non-deterministic */
	    t1->nd = 1;
	}
    }
    return(ret);
}